

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O3

void __thiscall
soul::StructuralParser::parseInputOrOutputName(StructuralParser *this,EndpointDeclaration *e)

{
  char *pcVar1;
  Scope *pSVar2;
  SourceCodeText *o;
  EndpointDetails *pEVar3;
  bool bVar4;
  SourceCodeText *oldObject;
  Identifier IVar5;
  Expression *pEVar6;
  SourceCodeText *o_00;
  
  o_00 = (this->super_SOULTokeniser).location.sourceCode.object;
  if (o_00 != (SourceCodeText *)0x0) {
    (o_00->super_RefCountedObject).refCount = (o_00->super_RefCountedObject).refCount + 1;
  }
  pcVar1 = (this->super_SOULTokeniser).location.location.data;
  pSVar2 = this->currentScope;
  o = (e->super_ASTObject).context.location.sourceCode.object;
  if (o_00 != o) {
    (e->super_ASTObject).context.location.sourceCode.object = o_00;
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o);
    o_00 = (SourceCodeText *)0x0;
  }
  (e->super_ASTObject).context.location.location.data = pcVar1;
  (e->super_ASTObject).context.parentScope = pSVar2;
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o_00);
  IVar5 = parseIdentifierWithMaxLength(this,0x80);
  (e->name).name = IVar5.name;
  bVar4 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27f67c);
  if (bVar4) {
    pEVar6 = parseExpression(this,false);
    pEVar3 = (e->details).object;
    if (pEVar3 == (EndpointDetails *)0x0) {
      throwInternalCompilerError("object != nullptr","operator*",0x3b);
    }
    (pEVar3->arraySize).object = pEVar6;
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27ebc9);
  }
  parseAnnotation(this,&e->annotation);
  return;
}

Assistant:

void parseInputOrOutputName (AST::EndpointDeclaration& e)
    {
        e.context = getContext();
        e.name = parseIdentifierWithMaxLength (AST::maxIdentifierLength);

        if (matchIf (Operator::openBracket))
        {
            e.getDetails().arraySize = parseExpression();
            expect (Operator::closeBracket);
        }

        parseAnnotation (e.annotation);
    }